

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O3

void ssh1_bpp_new_cipher(BinaryPacketProtocol *bpp,ssh_cipheralg *cipher,void *session_key)

{
  toplevel_callback_fn_t p_Var1;
  long *plVar2;
  LogContext *ctx;
  ssh_cipher *psVar3;
  crcda_ctx *pcVar4;
  char *event;
  
  if (bpp->vt != &ssh1_bpp_vtable) {
    __assert_fail("bpp->vt == &ssh1_bpp_vtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",
                  0x50,
                  "void ssh1_bpp_new_cipher(BinaryPacketProtocol *, const ssh_cipheralg *, const void *)"
                 );
  }
  if (bpp[-1].ic_in_raw.fn != (toplevel_callback_fn_t)0x0) {
    __assert_fail("!s->cipher_in",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",
                  0x53,
                  "void ssh1_bpp_new_cipher(BinaryPacketProtocol *, const ssh_cipheralg *, const void *)"
                 );
  }
  if (bpp[-1].ic_in_raw.ctx != (void *)0x0) {
    __assert_fail("!s->cipher_out",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",
                  0x54,
                  "void ssh1_bpp_new_cipher(BinaryPacketProtocol *, const ssh_cipheralg *, const void *)"
                 );
  }
  if (cipher != (ssh_cipheralg *)0x0) {
    psVar3 = (*cipher->new)(cipher);
    bpp[-1].ic_in_raw.fn = (toplevel_callback_fn_t)psVar3;
    psVar3 = (*cipher->new)(cipher);
    bpp[-1].ic_in_raw.ctx = psVar3;
    p_Var1 = bpp[-1].ic_in_raw.fn;
    (**(code **)(*(long *)p_Var1 + 0x18))(p_Var1,session_key);
    plVar2 = (long *)bpp[-1].ic_in_raw.ctx;
    (**(code **)(*plVar2 + 0x18))(plVar2,session_key);
    if (*(long *)&bpp[-1].ic_in_raw.queued != 0) {
      __assert_fail("!s->crcda_ctx",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",
                    0x5c,
                    "void ssh1_bpp_new_cipher(BinaryPacketProtocol *, const ssh_cipheralg *, const void *)"
                   );
    }
    pcVar4 = crcda_make_context();
    *(crcda_ctx **)&bpp[-1].ic_in_raw.queued = pcVar4;
    ctx = bpp->logctx;
    event = dupprintf("Initialised %s encryption",cipher->text_name);
    logevent_and_free(ctx,event);
    bpp[-1].ic_out_pq.fn = (toplevel_callback_fn_t)0x0;
    if ((uint)cipher->blksize < 9) {
      p_Var1 = bpp[-1].ic_in_raw.fn;
      (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1,&bpp[-1].ic_out_pq);
      plVar2 = (long *)bpp[-1].ic_in_raw.ctx;
      (**(code **)(*plVar2 + 0x10))(plVar2,&bpp[-1].ic_out_pq);
      return;
    }
    __assert_fail("cipher->blksize <= sizeof(s->iv)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",99,
                  "void ssh1_bpp_new_cipher(BinaryPacketProtocol *, const ssh_cipheralg *, const void *)"
                 );
  }
  return;
}

Assistant:

void ssh1_bpp_new_cipher(BinaryPacketProtocol *bpp,
                         const ssh_cipheralg *cipher,
                         const void *session_key)
{
    struct ssh1_bpp_state *s;
    assert(bpp->vt == &ssh1_bpp_vtable);
    s = container_of(bpp, struct ssh1_bpp_state, bpp);

    assert(!s->cipher_in);
    assert(!s->cipher_out);

    if (cipher) {
        s->cipher_in = ssh_cipher_new(cipher);
        s->cipher_out = ssh_cipher_new(cipher);
        ssh_cipher_setkey(s->cipher_in, session_key);
        ssh_cipher_setkey(s->cipher_out, session_key);

        assert(!s->crcda_ctx);
        s->crcda_ctx = crcda_make_context();

        bpp_logevent("Initialised %s encryption", cipher->text_name);

        memset(s->iv, 0, sizeof(s->iv));

        assert(cipher->blksize <= sizeof(s->iv));
        ssh_cipher_setiv(s->cipher_in, s->iv);
        ssh_cipher_setiv(s->cipher_out, s->iv);
    }
}